

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

void __thiscall smf::Options::xverify(Options *this,int error_check,int suppress)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char cVar1;
  pointer pbVar2;
  char *pcVar3;
  pointer pcVar4;
  int iVar5;
  int gargp;
  long lVar6;
  long lVar7;
  int running;
  int position;
  int local_38 [2];
  
  this->m_options_error_check = error_check;
  this->m_suppressQ = suppress != 0;
  this_00 = &this->m_argument;
  if ((this->m_argument).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_argument).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(this->m_oargv).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  local_38[0] = 0;
  local_38[1] = 0;
  iVar5 = this->m_oargc;
  gargp = 1;
  if (1 < iVar5) {
    do {
      lVar6 = (long)gargp;
      pbVar2 = (this->m_oargv).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[lVar6]._M_dataplus._M_p;
      cVar1 = this->m_optionFlag;
      if (*pcVar3 == cVar1) {
        if ((pcVar3[1] == '\0') || ((pcVar3[1] == *pcVar3 && (pcVar3[2] == '\0')))) {
          gargp = gargp + 1;
          lVar6 = (long)gargp;
          goto LAB_00114083;
        }
        iVar5 = storeOption(this,gargp,local_38 + 1,local_38);
        if (iVar5 != gargp) {
          local_38[0] = 0;
          local_38[1] = 0;
          gargp = iVar5;
        }
      }
      else {
LAB_00114083:
        if (((pbVar2[lVar6]._M_string_length == 2) &&
            (pcVar4 = pbVar2[lVar6]._M_dataplus._M_p, *pcVar4 == cVar1)) && (pcVar4[2] == cVar1)) {
          gargp = gargp + 1;
          break;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,pbVar2 + lVar6);
        gargp = gargp + 1;
      }
      iVar5 = this->m_oargc;
    } while (gargp < iVar5);
  }
  if (gargp < iVar5) {
    lVar7 = (long)gargp;
    lVar6 = lVar7 << 5;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,(value_type *)
                          ((long)&(((this->m_oargv).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar6));
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar7 < this->m_oargc);
  }
  return;
}

Assistant:

void Options::xverify(int error_check, int suppress) {
	m_options_error_check = error_check;
	int gargp = 1;
	int optionend = 0;

	if (suppress) {
		m_suppressQ = 1;
	} else {
		m_suppressQ = 0;
	}

	// if calling xverify again, must remove previous argument list.
	if (m_argument.size() != 0) {
		m_argument.clear();
	}

	m_argument.push_back(m_oargv[0]);
	int oldgargp;
	int position = 0;
	int running = 0;
	while (gargp < m_oargc && optionend == 0) {
		if (optionQ(m_oargv[gargp], gargp)) {
			oldgargp = gargp;
			gargp = storeOption(gargp, position, running);
			if (gargp != oldgargp) {
				running = 0;
				position = 0;
			}
		} else {
			if (m_oargv[gargp].size() == 2 && m_oargv[gargp][0] == getFlag() &&
				m_oargv[gargp][2] == getFlag() ) {
					optionend = 1;
				gargp++;
				break;
			} else {                          // this is an argument
				m_argument.push_back(m_oargv[gargp]);
				gargp++;
			}
		}
	}

	while (gargp < m_oargc) {
		m_argument.push_back(m_oargv[gargp]);
		gargp++;
	}

}